

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

String * __thiscall cm::String::operator=(String *this,initializer_list<char> il)

{
  String local_30;
  
  String(&local_30,il);
  operator=(this,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.string_.
              super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return this;
}

Assistant:

String& operator=(std::initializer_list<char> il)
  {
    *this = String(il);
    return *this;
  }